

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::geS(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = (this->type).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  iVar2 = (int)uVar1;
  if (iVar2 == 3) {
    bVar4 = SBORROW8((this->field_0).i64,(other->field_0).i64);
    bVar3 = (this->field_0).i64 - (other->field_0).i64 < 0;
  }
  else {
    if (iVar2 != 2) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x5ab);
    }
    bVar4 = SBORROW4((this->field_0).i32,(other->field_0).i32);
    bVar3 = (this->field_0).i32 - (other->field_0).i32 < 0;
  }
  *(uint *)&__return_storage_ptr__->field_0 = (uint)(bVar4 == bVar3);
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::geS(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(i32 >= other.i32);
    case Type::i64:
      return Literal(i64 >= other.i64);
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}